

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  string *psVar1;
  CompilerHLSL *this_00;
  bool bVar2;
  SPIRType *ts_6;
  CompilerError *pCVar3;
  uint uVar4;
  char (*in_R8) [2];
  string *in_R9;
  uint uVar5;
  uint uVar6;
  char (*pacVar7) [2];
  SPIRType *pSVar8;
  string local_3a0;
  SPIRAccessChain *local_380;
  char *local_378;
  uint local_36c;
  string load_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  CompilerHLSL *local_328;
  string template_expr;
  string base;
  SPIRType scalar_type;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  ts_6 = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  local_180._32_8_ = local_180 + 0x38;
  local_180._8_4_ = 0;
  local_180._0_8_ = &PTR__SPIRType_00464260;
  local_180._16_4_ = 0;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  local_180._12_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_88.id = 0;
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  local_68 = &p_Stack_38;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_180._20_4_ = ts_6->vecsize;
  local_180._24_4_ = ts_6->columns;
  local_180._128_4_ = local_180._12_4_;
  if ((ts_6->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    read_access_chain_array(this,lhs,chain);
    goto LAB_002c7c91;
  }
  if (*(int *)&(ts_6->super_IVariant).field_0xc == 0xf) {
    read_access_chain_struct(this,lhs,chain);
    goto LAB_002c7c91;
  }
  if ((ts_6->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&scalar_type,
               "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
               ,(allocator *)&base);
    CompilerError::CompilerError(pCVar3,(string *)&scalar_type);
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)&base,(string *)&chain->base);
  pacVar7 = (char (*) [2])0x2c73b7;
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
  if (bVar2) {
    pacVar7 = (char (*) [2])0x2c73ce;
    CompilerGLSL::convert_non_uniform_expression
              (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
  }
  local_36c = (this->hlsl_options).shader_model;
  load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
  load_expr._M_string_length = 0;
  template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
  template_expr._M_string_length = 0;
  load_expr.field_2._M_local_buf[0] = '\0';
  template_expr.field_2._M_local_buf[0] = '\0';
  if (0x3d < local_36c) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_3a0,this,ts_6,0);
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)&scalar_type,(spirv_cross *)0x39a652,(char (*) [2])&local_3a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4d05,in_R8);
    ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
    ::std::__cxx11::string::~string((string *)&scalar_type);
    pacVar7 = (char (*) [2])0x2c7465;
    ::std::__cxx11::string::~string((string *)&local_3a0);
  }
  local_380 = chain;
  local_328 = this;
  if (ts_6->columns == 1) {
    if (chain->row_major_matrix == false) {
      switch(ts_6->vecsize) {
      case 1:
        local_3a0._M_dataplus._M_p = "Load";
        break;
      case 2:
        local_3a0._M_dataplus._M_p = "Load2";
        break;
      case 3:
        local_3a0._M_dataplus._M_p = "Load3";
        break;
      case 4:
        local_3a0._M_dataplus._M_p = "Load4";
        break;
      default:
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&scalar_type,"Unknown vector size.",(allocator *)&local_348);
        CompilerError::CompilerError(pCVar3,(string *)&scalar_type);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (0x3d < local_36c) {
        local_3a0._M_dataplus._M_p = "Load";
      }
      in_R9 = (string *)0x3b5f90;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e0a7,
                 (char (*) [2])&local_3a0,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                 (char (*) [2])&chain->dynamic_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &chain->static_index,(int *)0x39e39a,pacVar7);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      if (local_36c < 0x3e) {
        if (1 < ts_6->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type,this,local_180,0);
          ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
          ::std::__cxx11::string::~string((string *)&scalar_type);
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      else {
        pSVar8 = ts_6;
        SPIRType::SPIRType(&scalar_type,ts_6);
        scalar_type.vecsize = 1;
        scalar_type.columns = 1;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_348,this,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_3a0,(spirv_cross *)0x39a652,(char (*) [2])&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4d05,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_3a0);
        ::std::__cxx11::string::~string((string *)&local_3a0);
        ::std::__cxx11::string::~string((string *)&local_348);
        if (1 < ts_6->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_348,this,ts_6,0);
          ::std::operator+(&local_3a0,&local_348,"(");
          ::std::__cxx11::string::append((string *)&load_expr);
          ::std::__cxx11::string::~string((string *)&local_3a0);
          ::std::__cxx11::string::~string((string *)&local_348);
        }
        ts_6 = pSVar8;
        SPIRType::~SPIRType(&scalar_type);
      }
      psVar1 = &local_380->dynamic_index;
      uVar6 = 0;
      while (uVar6 < ts_6->vecsize) {
        local_3a0._M_dataplus._M_p._0_4_ =
             local_380->matrix_stride * uVar6 + local_380->static_index;
        in_R9 = psVar1;
        join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)&base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                   (char (*) [6])&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                   (char (*) [2])psVar1,&local_3a0,(uint *)0x39e39a,(char (*) [2])ts_6);
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        uVar6 = uVar6 + 1;
        if (uVar6 < ts_6->vecsize) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      if (1 < ts_6->vecsize) goto LAB_002c77c7;
    }
  }
  else if (chain->row_major_matrix == false) {
    switch(ts_6->vecsize) {
    case 1:
      local_378 = "Load";
      break;
    case 2:
      local_378 = "Load2";
      break;
    case 3:
      local_378 = "Load3";
      break;
    case 4:
      local_378 = "Load4";
      break;
    default:
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&scalar_type,"Unknown vector size.",(allocator *)&local_3a0);
      CompilerError::CompilerError(pCVar3,(string *)&scalar_type);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_36c < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      pSVar8 = ts_6;
      SPIRType::SPIRType(&scalar_type,ts_6);
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_3a0,(spirv_cross *)0x39a652,(char (*) [2])&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4d05,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_348);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_3a0,this,ts_6,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      local_378 = "Load";
      SPIRType::~SPIRType(&scalar_type);
      ts_6 = pSVar8;
    }
    pacVar7 = (char (*) [2])0x2c7ad7;
    ::std::__cxx11::string::append((char *)&load_expr);
    uVar6 = 0;
    while (uVar6 < ts_6->columns) {
      local_3a0._M_dataplus._M_p._0_4_ = local_380->matrix_stride * uVar6 + local_380->static_index;
      in_R9 = (string *)0x3b5f90;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e0a7,
                 (char (*) [2])&local_378,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                 (char (*) [2])&chain->dynamic_index,&local_3a0,(uint *)0x39e39a,pacVar7);
      ::std::__cxx11::string::append((string *)&load_expr);
      pacVar7 = (char (*) [2])0x2c7b68;
      ::std::__cxx11::string::~string((string *)&scalar_type);
      uVar6 = uVar6 + 1;
      if (uVar6 < ts_6->columns) {
        pacVar7 = (char (*) [2])0x2c7b84;
        ::std::__cxx11::string::append((char *)&load_expr);
      }
    }
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  else {
    pSVar8 = ts_6;
    if (local_36c < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&scalar_type,this,ts_6,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
      SPIRType::SPIRType(&scalar_type,ts_6);
      scalar_type.vecsize = 1;
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_3a0,(spirv_cross *)0x39a652,(char (*) [2])&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4d05,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_348);
      SPIRType::~SPIRType(&scalar_type);
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    psVar1 = &local_380->dynamic_index;
    uVar6 = 0;
    while (uVar4 = uVar6, uVar4 < ts_6->columns) {
      uVar5 = 0;
      ts_6 = pSVar8;
      while (uVar6 = uVar4 + 1, pSVar8 = ts_6, uVar5 < ts_6->vecsize) {
        local_3a0._M_dataplus._M_p._0_4_ =
             local_380->matrix_stride * uVar5 + (ts_6->width >> 3) * uVar4 + local_380->static_index
        ;
        in_R9 = psVar1;
        join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)&base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                   (char (*) [6])&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                   (char (*) [2])psVar1,&local_3a0,(uint *)0x39e39a,(char (*) [2])ts_6);
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        uVar5 = uVar5 + 1;
        if ((uVar5 < ts_6->vecsize) || (uVar4 + 1 < ts_6->columns)) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
    }
LAB_002c77c7:
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  this_00 = local_328;
  if (local_36c < 0x3e) {
    (*(local_328->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
              (&scalar_type,local_328,ts_6,local_180);
    if (scalar_type.super_IVariant._8_8_ != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_3a0,(spirv_cross *)&scalar_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                 (char (*) [2])&load_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
    }
    ::std::__cxx11::string::~string((string *)&scalar_type);
  }
  if (lhs->_M_string_length == 0) {
    if (expr == (string *)0x0) {
      __assert_fail("expr",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_hlsl.cpp"
                    ,0x121e,
                    "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                   );
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)&load_expr);
  }
  else {
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this_00->super_CompilerGLSL,lhs,(char (*) [4])0x3b58ce,&load_expr,
               (char (*) [2])0x39d4f0);
  }
  ::std::__cxx11::string::~string((string *)&template_expr);
  ::std::__cxx11::string::~string((string *)&load_expr);
  ::std::__cxx11::string::~string((string *)&base);
LAB_002c7c91:
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}